

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTDiagMap.cpp
# Opt level: O2

Diagnostic * __thiscall slang::ast::ASTDiagMap::add(ASTDiagMap *this,Diagnostic *diag,bool *isNew)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  value_type_pointer ppVar3;
  uint uVar4;
  bool *pbVar5;
  size_t hash;
  ulong pos0;
  pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
  *ppVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  byte bVar16;
  undefined1 auVar17 [16];
  try_emplace_args_t local_a1;
  bool *local_a0;
  tuple<slang::DiagCode,_slang::SourceLocation> local_98;
  undefined1 local_88 [16];
  pointer local_78;
  ulong local_68;
  locator local_60;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  local_98.super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
  super__Tuple_impl<1UL,_slang::SourceLocation>.super__Head_base<1UL,_slang::SourceLocation,_false>.
  _M_head_impl = *(_Head_base<1UL,_slang::SourceLocation,_false> *)&diag->location;
  local_98.super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
  super__Head_base<0UL,_slang::DiagCode,_false>._M_head_impl = diag->code;
  local_88 = (undefined1  [16])0x0;
  local_78 = (pointer)0x0;
  hash = boost::unordered::detail::foa::mulx_mix::
         mix<slang::hash<std::tuple<slang::DiagCode,slang::SourceLocation>,void>,std::tuple<slang::DiagCode,slang::SourceLocation>>
                   ((hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void> *)this,&local_98
                   );
  pos0 = hash >> ((byte)(this->map).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
                        .arrays.groups_size_index & 0x3f);
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar3 = (this->map).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
           .arrays.elements_;
  local_68 = (this->map).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
             .arrays.groups_size_mask;
  uVar9 = 0;
  uVar11 = pos0;
  do {
    pgVar1 = (this->map).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
             .arrays.groups_ + uVar11;
    local_48 = pgVar1->m[0].n;
    uStack_47 = pgVar1->m[1].n;
    uStack_46 = pgVar1->m[2].n;
    bStack_45 = pgVar1->m[3].n;
    uStack_44 = pgVar1->m[4].n;
    uStack_43 = pgVar1->m[5].n;
    uStack_42 = pgVar1->m[6].n;
    bStack_41 = pgVar1->m[7].n;
    uStack_40 = pgVar1->m[8].n;
    uStack_3f = pgVar1->m[9].n;
    uStack_3e = pgVar1->m[10].n;
    bStack_3d = pgVar1->m[0xb].n;
    uStack_3c = pgVar1->m[0xc].n;
    uStack_3b = pgVar1->m[0xd].n;
    uStack_3a = pgVar1->m[0xe].n;
    bStack_39 = pgVar1->m[0xf].n;
    uVar13 = (uchar)uVar2;
    auVar17[0] = -(local_48 == uVar13);
    uVar14 = (uchar)((uint)uVar2 >> 8);
    auVar17[1] = -(uStack_47 == uVar14);
    uVar15 = (uchar)((uint)uVar2 >> 0x10);
    auVar17[2] = -(uStack_46 == uVar15);
    bVar16 = (byte)((uint)uVar2 >> 0x18);
    auVar17[3] = -(bStack_45 == bVar16);
    auVar17[4] = -(uStack_44 == uVar13);
    auVar17[5] = -(uStack_43 == uVar14);
    auVar17[6] = -(uStack_42 == uVar15);
    auVar17[7] = -(bStack_41 == bVar16);
    auVar17[8] = -(uStack_40 == uVar13);
    auVar17[9] = -(uStack_3f == uVar14);
    auVar17[10] = -(uStack_3e == uVar15);
    auVar17[0xb] = -(bStack_3d == bVar16);
    auVar17[0xc] = -(uStack_3c == uVar13);
    auVar17[0xd] = -(uStack_3b == uVar14);
    auVar17[0xe] = -(uStack_3a == uVar15);
    auVar17[0xf] = -(bStack_39 == bVar16);
    for (uVar7 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe); local_a0 = isNew,
        uVar7 != 0; uVar7 = uVar7 - 1 & uVar7) {
      uVar4 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar8 = (ulong)uVar4;
      if ((local_98.super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
           super__Head_base<0UL,_slang::DiagCode,_false>._M_head_impl ==
           ppVar3[uVar11 * 0xf + uVar8].first.
           super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
           super__Head_base<0UL,_slang::DiagCode,_false>._M_head_impl) &&
         (local_98.super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
          super__Tuple_impl<1UL,_slang::SourceLocation>.
          super__Head_base<1UL,_slang::SourceLocation,_false>._M_head_impl ==
          (_Head_base<1UL,_slang::SourceLocation,_false>)
          ppVar3[uVar11 * 0xf + uVar8].first.
          super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
          super__Tuple_impl<1UL,_slang::SourceLocation>.
          super__Head_base<1UL,_slang::SourceLocation,_false>._M_head_impl)) {
        ppVar6 = ppVar3 + uVar11 * 0xf + uVar8;
        bVar12 = false;
        goto LAB_00486bb8;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_39) == 0) break;
    lVar10 = uVar11 + uVar9;
    uVar9 = uVar9 + 1;
    uVar11 = lVar10 + 1U & local_68;
  } while (uVar9 <= local_68);
  if ((this->map).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
      .size_ctrl.size <
      (this->map).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<slang::DiagCode,slang::SourceLocation>,void>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>,std::allocator<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>const,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>
              (&local_60,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<slang::DiagCode,slang::SourceLocation>,void>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>,std::allocator<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>const,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>>
                *)this,pos0,hash,&local_a1,&local_98,
               (vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)local_88);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<slang::DiagCode,slang::SourceLocation>,void>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>,std::allocator<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>const,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>
              (&local_60,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<slang::DiagCode,slang::SourceLocation>,void>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>,std::allocator<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>const,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>>
                *)this,hash,&local_a1,&local_98,
               (vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)local_88);
  }
  bVar12 = true;
  ppVar6 = local_60.p;
LAB_00486bb8:
  pbVar5 = local_a0;
  std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector
            ((vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)local_88);
  *pbVar5 = bVar12;
  std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::
  emplace_back<slang::Diagnostic>(&ppVar6->second,diag);
  return (ppVar6->second).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
         _M_impl.super__Vector_impl_data._M_finish + -1;
}

Assistant:

Diagnostic& ASTDiagMap::add(Diagnostic diag, bool& isNew) {
    auto [it, inserted] = map.try_emplace({diag.code, diag.location}, std::vector<Diagnostic>{});
    isNew = inserted;
    it->second.emplace_back(std::move(diag));
    return it->second.back();
}